

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_sub.c
# Opt level: O1

void taia_sub(taia *t,taia *u,taia *v)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64 uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  
  uVar1 = u->nano;
  uVar2 = u->atto;
  uVar4 = (u->sec).x - (v->sec).x;
  (t->sec).x = uVar4;
  uVar6 = uVar1 - v->nano;
  t->nano = uVar6;
  uVar3 = v->atto;
  uVar5 = uVar2 - v->atto;
  t->atto = uVar5;
  if (uVar2 < uVar3) {
    t->atto = uVar5 + 1000000000;
    t->nano = uVar6 - 1;
  }
  if (uVar1 < t->nano) {
    t->nano = t->nano + 1000000000;
    (t->sec).x = uVar4 - 1;
  }
  return;
}

Assistant:

void taia_sub(struct taia *t,const struct taia *u,const struct taia *v)
{
  unsigned long unano = u->nano;
  unsigned long uatto = u->atto;
  
  t->sec.x = u->sec.x - v->sec.x;
  t->nano = unano - v->nano;
  t->atto = uatto - v->atto;
  if (t->atto > uatto) {
    t->atto += 1000000000UL;
    --t->nano;
  }
  if (t->nano > unano) {
    t->nano += 1000000000UL;
    --t->sec.x;
  }
}